

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * uniform_01_order_sample(int n,int *seed)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  uVar3 = (ulong)(uint)n;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = uVar3 * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  dVar4 = 1.0;
  for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    dVar5 = r8_uniform_01(seed);
    dVar5 = pow(dVar5,1.0 / (double)(int)uVar3);
    dVar4 = dVar4 * dVar5;
    pdVar1[uVar3 - 1] = dVar4;
  }
  return pdVar1;
}

Assistant:

double *uniform_01_order_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_01_ORDER_SAMPLE samples the Uniform 01 Order PDF.
//
//  Discussion:
//
//    In effect, this routine simply generates N samples of the
//    Uniform 01 PDF; but it generates them in order.  (Actually,
//    it generates them in descending order, but stores them in
//    the array in ascending order).  This saves the work of
//    sorting the results.  Moreover, if the order statistics
//    for another PDF are desired, and the inverse CDF is available,
//    then the desired values may be generated, presorted, by
//    calling this routine and using the results as input to the
//    inverse CDF routine.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    27 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Jerry Banks, editor,
//    Handbook of Simulation,
//    Engineering and Management Press Books, 1998, page 168.
//
//  Parameters:
//
//    Input, int N, the number of elements in the sample.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double UNIFORM_01_ORDER_SAMPLE[N], N samples of the Uniform 01 PDF, in
//    ascending order.
//
{
  int i;
  double u;
  double v;
  double *x;

  x = new double[n];

  v = 1.0;

  for ( i = n-1; 0 <= i; i-- )
  {
    u = r8_uniform_01 ( seed );
    v = v * pow ( u, 1.0 / static_cast<double>(i + 1 ) );
    x[i] = v;
  }

  return x;
}